

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanBlockEntry(Scanner *this)

{
  int iVar1;
  size_type sVar2;
  Exception *pEVar3;
  Mark local_88;
  undefined1 local_78 [32];
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [32];
  
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    pEVar3 = (Exception *)__cxa_allocate_exception(0x40);
    local_88.pos = (this->INPUT).m_mark.pos;
    local_88.line = (this->INPUT).m_mark.line;
    local_88.column = (this->INPUT).m_mark.column;
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"illegal block entry","");
    Exception::Exception(pEVar3,&local_88,(string *)local_78);
    *(undefined ***)pEVar3 = &PTR__BadFile_008779d0;
    __cxa_throw(pEVar3,&ParserException::typeinfo,BadFile::~BadFile);
  }
  if (this->m_simpleKeyAllowed != false) {
    PushIndentTo(this,(this->INPUT).m_mark.column,SEQ);
    this->m_simpleKeyAllowed = true;
    this->m_canBeJSONFlow = false;
    sVar2._0_4_ = (this->INPUT).m_mark.pos;
    sVar2._4_4_ = (this->INPUT).m_mark.line;
    iVar1 = (this->INPUT).m_mark.column;
    YAML::Stream::eat(&this->INPUT,1);
    local_78._0_8_ = (pointer)0x700000000;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    local_40._0_8_ = (pointer)0x0;
    local_40._8_4_ = 0;
    local_40._12_4_ = 0;
    local_40._16_4_ = 0;
    local_40._20_8_ = 0;
    local_78._8_8_ = sVar2;
    local_78._16_4_ = iVar1;
    local_78._24_8_ = &local_50;
    std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
              (&(this->m_tokens).c,(Token *)local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._24_8_ != &local_50) {
      operator_delete((void *)local_78._24_8_);
    }
    return;
  }
  pEVar3 = (Exception *)__cxa_allocate_exception(0x40);
  local_88.pos = (this->INPUT).m_mark.pos;
  local_88.line = (this->INPUT).m_mark.line;
  local_88.column = (this->INPUT).m_mark.column;
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"illegal block entry","");
  Exception::Exception(pEVar3,&local_88,(string *)local_78);
  *(undefined ***)pEVar3 = &PTR__BadFile_008779d0;
  __cxa_throw(pEVar3,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

void Scanner::ScanBlockEntry() {
  // we better be in the block context!
  if (InFlowContext())
    throw ParserException(INPUT.mark(), ErrorMsg::BLOCK_ENTRY);

  // can we put it here?
  if (!m_simpleKeyAllowed)
    throw ParserException(INPUT.mark(), ErrorMsg::BLOCK_ENTRY);

  PushIndentTo(INPUT.column(), IndentMarker::SEQ);
  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::BLOCK_ENTRY, mark));
}